

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ShowDebugLogFlag(char *name,ImGuiDebugLogFlags flags)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 IVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  pIVar3 = GImGui;
  fVar6 = (GImGui->Style).FramePadding.y;
  fVar6 = fVar6 + fVar6 + GImGui->FontSize;
  fVar8 = (GImGui->Style).ItemInnerSpacing.x + fVar6;
  if (name == (char *)0x0) {
    fVar7 = 0.0;
  }
  else {
    IVar5 = ImFont::CalcTextSizeA
                      (GImGui->Font,GImGui->FontSize,3.4028235e+38,-1.0,name,(char *)0x0,
                       (char **)0x0);
    fVar7 = (float)(int)(IVar5.x + 0.99999);
    fVar6 = (GImGui->Style).FramePadding.y;
    fVar6 = fVar6 + fVar6 + GImGui->FontSize;
  }
  pIVar2 = GImGui->CurrentWindow;
  fVar9 = (pIVar2->DC).CursorPosPrevLine.x + (GImGui->Style).ItemSpacing.x;
  if (((((pIVar2->WorkRect).Min.x <= fVar9) &&
       (fVar1 = (pIVar2->DC).CursorPosPrevLine.y, (pIVar2->WorkRect).Min.y <= fVar1)) &&
      (fVar8 + fVar7 + fVar9 <= (pIVar2->WorkRect).Max.x)) &&
     ((fVar6 + fVar1 <= (pIVar2->WorkRect).Max.y && (pIVar2->SkipItems == false)))) {
    (pIVar2->DC).CursorPos.x = fVar9;
    (pIVar2->DC).CursorPos.y = fVar1;
    (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
    (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
    (pIVar2->DC).IsSameLine = true;
  }
  bVar4 = ImGui::CheckboxFlags(name,&pIVar3->DebugLogFlags,flags);
  if (((bVar4) && ((pIVar3->IO).KeyShift == true)) && ((pIVar3->DebugLogFlags & flags) != 0)) {
    pIVar3->DebugLogAutoDisableFrames = '\x02';
    pIVar3->DebugLogAutoDisableFlags = pIVar3->DebugLogAutoDisableFlags | flags;
  }
  ImGui::SetItemTooltip
            ("Hold SHIFT when clicking to enable for 2 frames only (useful for spammy log entries)")
  ;
  return;
}

Assistant:

static void ShowDebugLogFlag(const char* name, ImGuiDebugLogFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImVec2 size(ImGui::GetFrameHeight() + g.Style.ItemInnerSpacing.x + ImGui::CalcTextSize(name).x, ImGui::GetFrameHeight());
    SameLineOrWrap(size); // FIXME-LAYOUT: To be done automatically once we rework ItemSize/ItemAdd into ItemLayout.
    if (ImGui::CheckboxFlags(name, &g.DebugLogFlags, flags) && g.IO.KeyShift && (g.DebugLogFlags & flags) != 0)
    {
        g.DebugLogAutoDisableFrames = 2;
        g.DebugLogAutoDisableFlags |= flags;
    }
    ImGui::SetItemTooltip("Hold SHIFT when clicking to enable for 2 frames only (useful for spammy log entries)");
}